

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall higan::EventLoop::CallPendingFunc(EventLoop *this)

{
  _Elt_pointer pfVar1;
  _Elt_pointer pfVar2;
  _Elt_pointer pfVar3;
  _Map_pointer ppfVar4;
  _Elt_pointer pfVar5;
  _Elt_pointer pfVar6;
  _Elt_pointer pfVar7;
  _Map_pointer ppfVar8;
  undefined8 uVar9;
  long lVar10;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *pqVar11;
  _Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *p_Var12;
  byte bVar13;
  _Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_88;
  _Map_pointer local_38;
  size_t sStack_30;
  MutexLockGuard local_20;
  MutexLockGuard guard;
  
  bVar13 = 0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map(&local_88,0);
  MutexLockGuard::MutexLockGuard(&local_20,&this->mutex_);
  ppfVar8 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node;
  pfVar7 = local_88._M_impl.super__Deque_impl_data._M_finish._M_last;
  pfVar6 = local_88._M_impl.super__Deque_impl_data._M_finish._M_first;
  pfVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppfVar4 = local_88._M_impl.super__Deque_impl_data._M_start._M_node;
  pfVar3 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
  pfVar2 = local_88._M_impl.super__Deque_impl_data._M_start._M_first;
  pfVar1 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_38 = local_88._M_impl.super__Deque_impl_data._M_map;
  sStack_30 = local_88._M_impl.super__Deque_impl_data._M_map_size;
  pqVar11 = &this->pending_func_queue_;
  p_Var12 = &local_88;
  for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (p_Var12->_M_impl).super__Deque_impl_data._M_map =
         (pqVar11->c).
         super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
         .super__Deque_impl_data._M_map;
    pqVar11 = (queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
               *)((long)pqVar11 + (ulong)bVar13 * -0x10 + 8);
    p_Var12 = (_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
              ((long)p_Var12 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = local_38;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = sStack_30;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = pfVar1;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = pfVar2;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = pfVar3;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = ppfVar4;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = pfVar5;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = pfVar6;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = pfVar7;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = ppfVar8;
  MutexLockGuard::~MutexLockGuard(&local_20);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (*(long *)((long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10) == 0) {
        uVar9 = std::__throw_bad_function_call();
        std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
                  ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                   &local_88);
        _Unwind_Resume(uVar9);
      }
      (**(code **)((long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x18))
                ((_Any_data *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                 &local_88);
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&local_88);
  return;
}

Assistant:

void EventLoop::CallPendingFunc()
{
	std::queue<EventLoopFunc> pending;

	{
		/**
		 * muduo这里太妙了 swap之后 立刻释放锁 对CallPendingFunc和RunInLoop影响都很小
		 * 如果不进行拷贝 而是加锁后直接处理pending_func_queue_会对RunInLoop产生较大影响
		 */
		MutexLockGuard guard(mutex_);
		pending.swap(pending_func_queue_);
	}

	while (!pending.empty())
	{
		pending.front()();
		pending.pop();
	}
}